

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

Index __thiscall wasm::Pusher::optimizeSegment(Pusher *this,Index firstPushable,Index pushPoint)

{
  value_type pLVar1;
  Expression *pEVar2;
  Index IVar3;
  uint uVar4;
  Expression **ppEVar5;
  EffectAnalyzer *other;
  size_type sVar6;
  reference ppLVar7;
  bool bVar8;
  uint local_1d8;
  Index local_1d4;
  Index i_2;
  Index i_1;
  Index skip;
  Index last;
  Index total;
  EffectAnalyzer *effects;
  LocalSet *pushable;
  undefined1 local_1a8 [4];
  Index i;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> toPush;
  undefined1 local_180 [8];
  EffectAnalyzer cumulativeEffects;
  Index pushPoint_local;
  Index firstPushable_local;
  Pusher *this_local;
  
  bVar8 = false;
  if ((firstPushable != 0xffffffff) && (bVar8 = false, pushPoint != 0xffffffff)) {
    bVar8 = firstPushable < pushPoint;
  }
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       pushPoint;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       firstPushable;
  if (!bVar8) {
    __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                  ,0xb6,"Index wasm::Pusher::optimizeSegment(Index, Index)");
  }
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_180,this->passOptions,this->module);
  ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      (&this->list->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (ulong)(Index)cumulativeEffects.delegateTargets._M_t._M_impl.
                                     super__Rb_tree_header._M_node_count);
  EffectAnalyzer::walk((EffectAnalyzer *)local_180,*ppEVar5);
  EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_180);
  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::vector
            ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8);
  pushable._4_4_ =
       (Index)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while( true ) {
    pushable._4_4_ = pushable._4_4_ - 1;
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this->list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)pushable._4_4_);
    effects = (EffectAnalyzer *)isPushable(this,*ppEVar5);
    if (effects == (EffectAnalyzer *)0x0) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)pushable._4_4_);
      EffectAnalyzer::walk((EffectAnalyzer *)local_180,*ppEVar5);
    }
    else {
      other = getPushableEffects(this,(LocalSet *)effects);
      bVar8 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_180,other);
      if (bVar8) {
        EffectAnalyzer::mergeIn((EffectAnalyzer *)local_180,other);
      }
      else {
        std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
                  ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8,
                   (value_type *)&effects);
      }
    }
    if (pushable._4_4_ ==
        cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
    break;
    if (pushable._4_4_ == 0) {
      __assert_fail("i > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                    ,0xde,"Index wasm::Pusher::optimizeSegment(Index, Index)");
    }
  }
  sVar6 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::size
                    ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8);
  IVar3 = (Index)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar6 != 0) {
    sVar6 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::size
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8);
    uVar4 = (uint)sVar6;
    i_2 = 0;
    for (local_1d4 = cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count._4_4_;
        local_1d4 <=
        (Index)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_1d4 = local_1d4 + 1) {
      if (i_2 < uVar4) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)local_1d4);
        pLVar1 = (value_type)*ppEVar5;
        ppLVar7 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                            ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                             local_1a8,(ulong)((uVar4 - 1) - i_2));
        if (pLVar1 != *ppLVar7) goto LAB_01b34ff3;
        i_2 = i_2 + 1;
      }
      else {
LAB_01b34ff3:
        if (i_2 != 0) {
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this->list->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)local_1d4);
          pEVar2 = *ppEVar5;
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this->list->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)(local_1d4 - i_2));
          *ppEVar5 = pEVar2;
        }
      }
    }
    if (i_2 != uVar4) {
      __assert_fail("skip == total",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                    ,0xf4,"Index wasm::Pusher::optimizeSegment(Index, Index)");
    }
    for (local_1d8 = 0; local_1d8 < uVar4; local_1d8 = local_1d8 + 1) {
      ppLVar7 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                          ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8,
                           (ulong)local_1d8);
      pLVar1 = *ppLVar7;
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)((Index)cumulativeEffects.delegateTargets._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count - local_1d8));
      *ppEVar5 = (Expression *)pLVar1;
    }
    IVar3 = (Index)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count - uVar4;
  }
  this_local._4_4_ = IVar3 + 1;
  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~vector
            ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_1a8);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_180);
  return this_local._4_4_;
}

Assistant:

Index optimizeSegment(Index firstPushable, Index pushPoint) {
    // The interesting part. Starting at firstPushable, try to push
    // code past pushPoint. We start at the end since we are pushing
    // forward, that way we can push later things out of the way
    // of earlier ones. Once we know all we can push, we push it all
    // in one pass, keeping the order of the pushables intact.
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);
    // everything that matters if you want to be pushed past the pushPoint
    EffectAnalyzer cumulativeEffects(passOptions, module);
    cumulativeEffects.walk(list[pushPoint]);
    // It is ok to ignore branching out of the block here, that is the crucial
    // point of this optimization. That is, we are in a situation like this:
    //
    // {
    //   x = value;
    //   if (..) break;
    //   foo(x);
    // }
    //
    // If the branch is taken, then that's fine, it will jump out of this block
    // and reach some outer scope, and in that case we never need x at all
    // (since we've proven before that x is not used outside of this block, see
    // numGetsSoFar which we use for that). Similarly, control flow could
    // transfer away via a return or an exception and that would be ok as well.
    cumulativeEffects.ignoreControlFlowTransfers();
    std::vector<LocalSet*> toPush;
    Index i = pushPoint - 1;
    while (1) {
      auto* pushable = isPushable(list[i]);
      if (pushable) {
        const auto& effects = getPushableEffects(pushable);
        if (cumulativeEffects.invalidates(effects)) {
          // we can't push this, so further pushables must pass it
          cumulativeEffects.mergeIn(effects);
        } else {
          // we can push this, great!
          toPush.push_back(pushable);
        }
      } else {
        // something that can't be pushed, so it might block further pushing
        cumulativeEffects.walk(list[i]);
      }
      if (i == firstPushable) {
        // no point in looking further
        break;
      }
      assert(i > 0);
      i--;
    }
    if (toPush.size() == 0) {
      // nothing to do, can only continue after the push point
      return pushPoint + 1;
    }
    // we have work to do!
    Index total = toPush.size();
    Index last = total - 1;
    Index skip = 0;
    for (Index i = firstPushable; i <= pushPoint; i++) {
      // we see the first elements at the end of toPush
      if (skip < total && list[i] == toPush[last - skip]) {
        // this is one of our elements to push, skip it
        skip++;
      } else {
        if (skip) {
          list[i - skip] = list[i];
        }
      }
    }
    assert(skip == total);
    // write out the skipped elements
    for (Index i = 0; i < total; i++) {
      list[pushPoint - i] = toPush[i];
    }
    // proceed right after the push point, we may push the pushed elements again
    return pushPoint - total + 1;
  }